

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_reaction_diffusion_mri.c
# Opt level: O3

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = *user_data;
  lVar3 = N_VGetArrayPointer();
  if ((lVar3 != 0) && (lVar4 = N_VGetArrayPointer(ydot), lVar4 != 0)) {
    if (lVar2 < 1) {
      return 0;
    }
    lVar5 = 0;
    do {
      dVar1 = *(double *)(lVar3 + lVar5 * 8);
      *(double *)(lVar4 + lVar5 * 8) = dVar1 * dVar1 * (1.0 - dVar1);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
    return 0;
  }
  ff_cold_1();
  return 1;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunindextype i;

  /* access state array data */
  Y = N_VGetArrayPointer(y);
  if (check_retval((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }

  /* access RHS array data */
  Ydot = N_VGetArrayPointer(ydot);
  if (check_retval((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing reaction term */
  for (i = 0; i < N; i++) { Ydot[i] = Y[i] * Y[i] * (SUN_RCONST(1.0) - Y[i]); }

  /* Return with success */
  return 0;
}